

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_tests.cpp
# Opt level: O1

void validation_tests::TestBlockSubsidyHalvings(Params *consensusParams)

{
  int iVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar4;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  ulong local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  CAmount nSubsidy;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  CAmount nPreviousSubsidy;
  ulong *local_b0;
  undefined **local_a8;
  element_type *local_a0;
  shared_count sStack_98;
  ulong **local_90;
  CAmount *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  CAmount **local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nPreviousSubsidy = 10000000000;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1e;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
  local_f8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_b0 = (ulong *)&nSubsidy;
  nSubsidy = 10000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(nPreviousSubsidy == 10000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_58 = "";
  local_68 = &local_88;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abed0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_a8 = &PTR__lazy_ostream_013abed0;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_88 = &nPreviousSubsidy;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_f8,1,2,REQUIRE,0xf79b37,(size_t)&local_60,0x1e,
             &local_80,"nInitialSubsidy * 2",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  iVar1 = 0;
  do {
    nSubsidy = GetBlockSubsidy(consensusParams->nSubsidyHalvingInterval * iVar1,consensusParams);
    local_110 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_108 = "";
    local_120 = &boost::unit_test::basic_cstring<char_const>::null;
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar4 = 0x788e22;
    file_00.m_end = (iterator)0x22;
    file_00.m_begin = (iterator)&local_110;
    msg_00.m_end = pvVar3;
    msg_00.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_120,
               msg_00);
    local_a8 = (undefined **)CONCAT71(local_a8._1_7_,nSubsidy < 0x12a05f201);
    local_a0 = (element_type *)0x0;
    sStack_98.pi_ = (sp_counted_base *)0x0;
    local_f8._0_8_ = "nSubsidy <= nInitialSubsidy";
    local_f8._8_8_ = "";
    local_80.m_empty = false;
    local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_68 = (CAmount **)local_f8;
    local_130 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_128 = "";
    pvVar2 = (iterator)0x1;
    pvVar3 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar4,(size_t)&local_130,0x22);
    boost::detail::shared_count::~shared_count(&sStack_98);
    local_140 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_138 = "";
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x23;
    file_01.m_begin = (iterator)&local_140;
    msg_01.m_end = pvVar3;
    msg_01.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
               msg_01);
    local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
    local_f8._0_8_ = &PTR__lazy_ostream_013abb30;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = "";
    local_158 = nPreviousSubsidy / 2;
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(nSubsidy == local_158);
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_60 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_58 = "";
    local_88 = &nSubsidy;
    local_80.m_empty = false;
    local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abed0;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_68 = &local_88;
    local_b0 = &local_158;
    local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
    local_a8 = &PTR__lazy_ostream_013abed0;
    sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_90 = &local_b0;
    pvVar2 = (iterator)0x1;
    pvVar3 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,(lazy_ostream *)local_f8,1,2,REQUIRE,0xf79b78,(size_t)&local_60,0x23,
               &local_80,"nPreviousSubsidy / 2",(assertion_result *)&local_a8);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    nPreviousSubsidy = nSubsidy;
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x40);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x26;
  file_02.m_begin = (iterator)&local_168;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_178,
             msg_02);
  local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
  local_f8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  nSubsidy = GetBlockSubsidy(consensusParams->nSubsidyHalvingInterval << 6,consensusParams);
  local_158 = local_158 & 0xffffffff00000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(nSubsidy == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_58 = "";
  local_88 = &nSubsidy;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abed0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_158;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_a8 = &PTR__lazy_ostream_013abcf0;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_f8,1,2,REQUIRE,0xf79b96,(size_t)&local_60,0x26,
             &local_80,"0",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestBlockSubsidyHalvings(const Consensus::Params& consensusParams)
{
    int maxHalvings = 64;
    CAmount nInitialSubsidy = 50 * COIN;

    CAmount nPreviousSubsidy = nInitialSubsidy * 2; // for height == 0
    BOOST_CHECK_EQUAL(nPreviousSubsidy, nInitialSubsidy * 2);
    for (int nHalvings = 0; nHalvings < maxHalvings; nHalvings++) {
        int nHeight = nHalvings * consensusParams.nSubsidyHalvingInterval;
        CAmount nSubsidy = GetBlockSubsidy(nHeight, consensusParams);
        BOOST_CHECK(nSubsidy <= nInitialSubsidy);
        BOOST_CHECK_EQUAL(nSubsidy, nPreviousSubsidy / 2);
        nPreviousSubsidy = nSubsidy;
    }
    BOOST_CHECK_EQUAL(GetBlockSubsidy(maxHalvings * consensusParams.nSubsidyHalvingInterval, consensusParams), 0);
}